

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool basist::transcode_uastc_to_pvrtc1_4_rgba
               (uastc_block *pSrc_blocks,void *pDst_blocks,uint32_t num_blocks_x,
               uint32_t num_blocks_y,bool high_quality)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  anon_union_4_3_898e29d3_for_color32_0 aVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  undefined4 in_register_0000000c;
  uint uVar23;
  uint uVar24;
  uint32_t uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uastc_block *blk;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  byte bVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  uint uVar50;
  anon_union_4_3_898e29d3_for_color32_0 *paVar51;
  ulong uVar52;
  uint *puVar53;
  int iVar54;
  uint uVar55;
  uint uVar56;
  int iVar57;
  int iVar58;
  uint uVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  color32 block_pixels [16];
  vector<unsigned_int> temp_endpoints;
  uint32_t *pE_rows [3];
  ulong local_2e8;
  ulong local_2e0;
  anon_union_4_3_898e29d3_for_color32_0 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  byte bStack_2bc;
  byte bStack_2bb;
  byte bStack_2ba;
  byte bStack_2b9;
  undefined4 uStack_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  byte local_2ac;
  byte local_2ab;
  byte local_2aa;
  byte local_2a9;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  byte local_29c;
  byte local_29b;
  byte local_29a;
  byte local_299;
  byte local_298;
  byte local_297;
  byte local_296;
  byte local_295;
  byte local_294;
  byte local_293;
  byte local_292;
  byte local_291;
  byte local_290;
  byte local_28f;
  byte local_28e;
  byte local_28d;
  byte local_28c;
  byte local_28b;
  byte local_28a;
  byte local_289;
  uint local_284;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  ulong local_268;
  int local_260;
  uint local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  int local_1a0;
  int local_19c;
  elemental_vector local_198;
  ulong local_188;
  ulong local_180;
  uastc_block *local_178;
  ulong local_170;
  ulong local_168;
  void *local_160;
  void *local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  anon_union_4_3_898e29d3_for_color32_0 local_118;
  uint uStack_114;
  undefined4 local_110;
  uint uStack_10c;
  undefined4 local_108;
  uint uStack_104;
  undefined4 local_100;
  uint uStack_fc;
  undefined4 local_f8;
  uint uStack_f4;
  byte local_f0;
  byte local_ef;
  byte local_ee;
  byte local_ed;
  uint local_ec;
  undefined4 local_e8;
  uint uStack_e4;
  undefined4 local_e0;
  uint uStack_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_b8;
  uint32_t local_b4;
  uint32_t local_b0;
  long local_90;
  long local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48 [3];
  short sVar75;
  short sVar92;
  
  local_1f8 = CONCAT44(in_register_0000000c,num_blocks_y);
  if (((num_blocks_y == 0 || num_blocks_x == 0) ||
      (uVar19 = num_blocks_x * 4 - 1, (num_blocks_x * 4 ^ uVar19) <= uVar19)) ||
     (uVar19 = num_blocks_y * 4 - 1, (num_blocks_y * 4 ^ uVar19) <= uVar19)) {
    bVar41 = 0;
  }
  else {
    uVar25 = num_blocks_y * num_blocks_x;
    local_198.m_p = (void *)0x0;
    local_198.m_size = 0;
    local_198.m_capacity = 0;
    local_178 = pSrc_blocks;
    local_160 = pDst_blocks;
    if (uVar25 != 0) {
      basisu::elemental_vector::increase_capacity
                (&local_198,uVar25,uVar25 == 1,4,(object_mover)0x0,false);
      memset((void *)((ulong)local_198.m_size * 4 + (long)local_198.m_p),0,
             (ulong)(uVar25 - local_198.m_size) << 2);
      local_198.m_size = uVar25;
    }
    uVar29 = (ulong)local_198.m_size;
    pvVar1 = local_198.m_p;
    local_188 = local_1f8 & 0xffffffff;
    local_278 = (ulong)((int)local_1f8 + (uint)((int)local_1f8 == 0));
    uVar31 = 0;
    uVar18 = 0;
    local_208 = 0;
    local_238 = (ulong)num_blocks_x;
    do {
      blk = local_178 + uVar31;
      uVar32 = uVar31;
      uVar52 = (ulong)(num_blocks_x + (num_blocks_x == 0));
      do {
        bVar9 = unpack_uastc(blk,(color32 *)&local_2c8.field_0,false);
        if (!bVar9) {
LAB_00142e65:
          if ((local_208 & 1) == 0) goto LAB_00143fa5;
          goto LAB_00142e76;
        }
        auVar95[0] = (local_2c8.field_0.a < uStack_2c4._3_1_) * local_2c8.field_0.a |
                     (local_2c8.field_0.a >= uStack_2c4._3_1_) * uStack_2c4._3_1_;
        auVar95[1] = 0;
        auVar95[2] = (uStack_2c0._3_1_ < bStack_2b9) * uStack_2c0._3_1_ |
                     (uStack_2c0._3_1_ >= bStack_2b9) * bStack_2b9;
        auVar95[3] = 0;
        auVar95[4] = (uStack_2b8._3_1_ < local_2b4._3_1_) * uStack_2b8._3_1_ |
                     (uStack_2b8._3_1_ >= local_2b4._3_1_) * local_2b4._3_1_;
        auVar95[5] = 0;
        auVar95[6] = (local_2b0._3_1_ < local_2a9) * local_2b0._3_1_ |
                     (local_2b0._3_1_ >= local_2a9) * local_2a9;
        auVar95[7] = 0;
        auVar95[8] = (local_2a8._3_1_ < local_2a4._3_1_) * local_2a8._3_1_ |
                     (local_2a8._3_1_ >= local_2a4._3_1_) * local_2a4._3_1_;
        auVar95[9] = 0;
        auVar95[10] = (local_2a0._3_1_ < local_299) * local_2a0._3_1_ |
                      (local_2a0._3_1_ >= local_299) * local_299;
        auVar95[0xb] = 0;
        auVar95[0xc] = (local_295 < local_291) * local_295 | (local_295 >= local_291) * local_291;
        auVar95[0xd] = 0;
        auVar95[0xe] = (local_28d < local_289) * local_28d | (local_28d >= local_289) * local_289;
        auVar95[0xf] = 0;
        auVar95 = phminposuw(auVar95);
        auVar96[0] = (local_2c8.field_0.r < (byte)uStack_2c4) * local_2c8.field_0.r |
                     (local_2c8.field_0.r >= (byte)uStack_2c4) * (byte)uStack_2c4;
        auVar96[1] = 0;
        auVar96[2] = ((byte)uStack_2c0 < bStack_2bc) * (byte)uStack_2c0 |
                     ((byte)uStack_2c0 >= bStack_2bc) * bStack_2bc;
        auVar96[3] = 0;
        auVar96[4] = ((byte)uStack_2b8 < (byte)local_2b4) * (byte)uStack_2b8 |
                     ((byte)uStack_2b8 >= (byte)local_2b4) * (byte)local_2b4;
        auVar96[5] = 0;
        auVar96[6] = ((byte)local_2b0 < local_2ac) * (byte)local_2b0 |
                     ((byte)local_2b0 >= local_2ac) * local_2ac;
        auVar96[7] = 0;
        auVar96[8] = ((byte)local_2a8 < (byte)local_2a4) * (byte)local_2a8 |
                     ((byte)local_2a8 >= (byte)local_2a4) * (byte)local_2a4;
        auVar96[9] = 0;
        auVar96[10] = ((byte)local_2a0 < local_29c) * (byte)local_2a0 |
                      ((byte)local_2a0 >= local_29c) * local_29c;
        auVar96[0xb] = 0;
        auVar96[0xc] = (local_298 < local_294) * local_298 | (local_298 >= local_294) * local_294;
        auVar96[0xd] = 0;
        auVar96[0xe] = (local_290 < local_28c) * local_290 | (local_290 >= local_28c) * local_28c;
        auVar96[0xf] = 0;
        auVar96 = phminposuw(auVar96);
        auVar97[0] = (local_2c8.field_0.g < uStack_2c4._1_1_) * local_2c8.field_0.g |
                     (local_2c8.field_0.g >= uStack_2c4._1_1_) * uStack_2c4._1_1_;
        auVar97[1] = 0;
        auVar97[2] = (uStack_2c0._1_1_ < bStack_2bb) * uStack_2c0._1_1_ |
                     (uStack_2c0._1_1_ >= bStack_2bb) * bStack_2bb;
        auVar97[3] = 0;
        auVar97[4] = (uStack_2b8._1_1_ < local_2b4._1_1_) * uStack_2b8._1_1_ |
                     (uStack_2b8._1_1_ >= local_2b4._1_1_) * local_2b4._1_1_;
        auVar97[5] = 0;
        auVar97[6] = (local_2b0._1_1_ < local_2ab) * local_2b0._1_1_ |
                     (local_2b0._1_1_ >= local_2ab) * local_2ab;
        auVar97[7] = 0;
        auVar97[8] = (local_2a8._1_1_ < local_2a4._1_1_) * local_2a8._1_1_ |
                     (local_2a8._1_1_ >= local_2a4._1_1_) * local_2a4._1_1_;
        auVar97[9] = 0;
        auVar97[10] = (local_2a0._1_1_ < local_29b) * local_2a0._1_1_ |
                      (local_2a0._1_1_ >= local_29b) * local_29b;
        auVar97[0xb] = 0;
        auVar97[0xc] = (local_297 < local_293) * local_297 | (local_297 >= local_293) * local_293;
        auVar97[0xd] = 0;
        auVar97[0xe] = (local_28f < local_28b) * local_28f | (local_28f >= local_28b) * local_28b;
        auVar97[0xf] = 0;
        auVar97 = phminposuw(auVar97);
        auVar98[0] = (local_2c8.field_0.b < uStack_2c4._2_1_) * local_2c8.field_0.b |
                     (local_2c8.field_0.b >= uStack_2c4._2_1_) * uStack_2c4._2_1_;
        auVar98[1] = 0;
        auVar98[2] = (uStack_2c0._2_1_ < bStack_2ba) * uStack_2c0._2_1_ |
                     (uStack_2c0._2_1_ >= bStack_2ba) * bStack_2ba;
        auVar98[3] = 0;
        auVar98[4] = (uStack_2b8._2_1_ < local_2b4._2_1_) * uStack_2b8._2_1_ |
                     (uStack_2b8._2_1_ >= local_2b4._2_1_) * local_2b4._2_1_;
        auVar98[5] = 0;
        auVar98[6] = (local_2b0._2_1_ < local_2aa) * local_2b0._2_1_ |
                     (local_2b0._2_1_ >= local_2aa) * local_2aa;
        auVar98[7] = 0;
        auVar98[8] = (local_2a8._2_1_ < local_2a4._2_1_) * local_2a8._2_1_ |
                     (local_2a8._2_1_ >= local_2a4._2_1_) * local_2a4._2_1_;
        auVar98[9] = 0;
        auVar98[10] = (local_2a0._2_1_ < local_29a) * local_2a0._2_1_ |
                      (local_2a0._2_1_ >= local_29a) * local_29a;
        auVar98[0xb] = 0;
        auVar98[0xc] = (local_296 < local_292) * local_296 | (local_296 >= local_292) * local_292;
        auVar98[0xd] = 0;
        auVar98[0xe] = (local_28e < local_28a) * local_28e | (local_28e >= local_28a) * local_28a;
        auVar98[0xf] = 0;
        auVar98 = phminposuw(auVar98);
        uVar38 = auVar96._0_4_ & 0xff;
        uVar19 = auVar97._0_4_ & 0xff;
        if (auVar95[0] == -1) {
          if (0x1f < (byte)(g_pvrtc_5_floor[uVar19] | g_pvrtc_5_floor[uVar38])) {
            __assert_fail("(r < 32) && (g < 32) && (b < 16)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xc4e,
                          "void basist::pvrtc4_block::set_endpoint_raw(uint32_t, const color32 &, bool)"
                         );
          }
          uVar19 = (uint)(byte)g_pvrtc_4_floor[auVar98._0_4_ & 0xff] * 2 |
                   (uint)(byte)g_pvrtc_5_floor[uVar19] << 5 |
                   (uint)(byte)g_pvrtc_5_floor[uVar38] << 10 | 0x8000;
        }
        else {
          if (0xf < (byte)(g_pvrtc_4_floor[uVar19] | g_pvrtc_4_floor[uVar38])) {
LAB_00143fdf:
            __assert_fail("(r < 16) && (g < 16) && (b < 8) && (a < 8)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xc5f,
                          "void basist::pvrtc4_block::set_endpoint_raw(uint32_t, const color32 &, bool)"
                         );
          }
          if (7 < (byte)(g_pvrtc_3_floor[auVar98._0_4_ & 0xff] |
                        g_pvrtc_alpha_floor[auVar95._0_4_ & 0xff])) goto LAB_00143fdf;
          uVar19 = ((uint)(byte)g_pvrtc_4_floor[uVar19] << 4 |
                   (uint)(byte)g_pvrtc_4_floor[uVar38] << 8 |
                   (uint)(byte)g_pvrtc_alpha_floor[auVar95._0_4_ & 0xff] << 0xc) +
                   (uint)(byte)g_pvrtc_3_floor[auVar98._0_4_ & 0xff] * 2;
        }
        bVar41 = local_2c8.field_0.r ^ 0xff;
        bVar60 = (byte)uStack_2c4 ^ 0xff;
        bVar61 = (byte)uStack_2c0 ^ 0xff;
        bVar62 = bStack_2bc ^ 0xff;
        bVar63 = (byte)uStack_2b8 ^ 0xff;
        bVar64 = (byte)local_2b4 ^ 0xff;
        bVar65 = (byte)local_2b0 ^ 0xff;
        bVar66 = local_2ac ^ 0xff;
        bVar67 = (byte)local_2a8 ^ 0xff;
        bVar68 = (byte)local_2a4 ^ 0xff;
        bVar69 = (byte)local_2a0 ^ 0xff;
        bVar70 = local_29c ^ 0xff;
        bVar71 = local_298 ^ 0xff;
        bVar72 = local_294 ^ 0xff;
        bVar73 = local_290 ^ 0xff;
        bVar74 = local_28c ^ 0xff;
        auVar99[0] = (bVar41 < bVar60) * bVar41 | (bVar41 >= bVar60) * bVar60;
        auVar99[1] = 0;
        auVar99[2] = (bVar61 < bVar62) * bVar61 | (bVar61 >= bVar62) * bVar62;
        auVar99[3] = 0;
        auVar99[4] = (bVar63 < bVar64) * bVar63 | (bVar63 >= bVar64) * bVar64;
        auVar99[5] = 0;
        auVar99[6] = (bVar65 < bVar66) * bVar65 | (bVar65 >= bVar66) * bVar66;
        auVar99[7] = 0;
        auVar99[8] = (bVar67 < bVar68) * bVar67 | (bVar67 >= bVar68) * bVar68;
        auVar99[9] = 0;
        auVar99[10] = (bVar69 < bVar70) * bVar69 | (bVar69 >= bVar70) * bVar70;
        auVar99[0xb] = 0;
        auVar99[0xc] = (bVar71 < bVar72) * bVar71 | (bVar71 >= bVar72) * bVar72;
        auVar99[0xd] = 0;
        auVar99[0xe] = (bVar73 < bVar74) * bVar73 | (bVar73 >= bVar74) * bVar74;
        auVar99[0xf] = 0;
        auVar98 = phminposuw(auVar99);
        bVar41 = local_2c8.field_0.g ^ 0xff;
        bVar60 = uStack_2c4._1_1_ ^ 0xff;
        bVar61 = uStack_2c0._1_1_ ^ 0xff;
        bVar62 = bStack_2bb ^ 0xff;
        bVar63 = uStack_2b8._1_1_ ^ 0xff;
        bVar64 = local_2b4._1_1_ ^ 0xff;
        bVar65 = local_2b0._1_1_ ^ 0xff;
        bVar66 = local_2ab ^ 0xff;
        bVar67 = local_2a8._1_1_ ^ 0xff;
        bVar68 = local_2a4._1_1_ ^ 0xff;
        bVar69 = local_2a0._1_1_ ^ 0xff;
        bVar70 = local_29b ^ 0xff;
        bVar71 = local_297 ^ 0xff;
        bVar72 = local_293 ^ 0xff;
        bVar73 = local_28f ^ 0xff;
        bVar74 = local_28b ^ 0xff;
        auVar94[0] = (bVar41 < bVar60) * bVar41 | (bVar41 >= bVar60) * bVar60;
        auVar94[1] = 0;
        auVar94[2] = (bVar61 < bVar62) * bVar61 | (bVar61 >= bVar62) * bVar62;
        auVar94[3] = 0;
        auVar94[4] = (bVar63 < bVar64) * bVar63 | (bVar63 >= bVar64) * bVar64;
        auVar94[5] = 0;
        auVar94[6] = (bVar65 < bVar66) * bVar65 | (bVar65 >= bVar66) * bVar66;
        auVar94[7] = 0;
        auVar94[8] = (bVar67 < bVar68) * bVar67 | (bVar67 >= bVar68) * bVar68;
        auVar94[9] = 0;
        auVar94[10] = (bVar69 < bVar70) * bVar69 | (bVar69 >= bVar70) * bVar70;
        auVar94[0xb] = 0;
        auVar94[0xc] = (bVar71 < bVar72) * bVar71 | (bVar71 >= bVar72) * bVar72;
        auVar94[0xd] = 0;
        auVar94[0xe] = (bVar73 < bVar74) * bVar73 | (bVar73 >= bVar74) * bVar74;
        auVar94[0xf] = 0;
        auVar97 = phminposuw(auVar94);
        bVar41 = local_2c8.field_0.b ^ 0xff;
        bVar60 = uStack_2c4._2_1_ ^ 0xff;
        bVar61 = uStack_2c0._2_1_ ^ 0xff;
        bVar62 = bStack_2ba ^ 0xff;
        bVar63 = uStack_2b8._2_1_ ^ 0xff;
        bVar64 = local_2b4._2_1_ ^ 0xff;
        bVar65 = local_2b0._2_1_ ^ 0xff;
        bVar66 = local_2aa ^ 0xff;
        bVar67 = local_2a8._2_1_ ^ 0xff;
        bVar68 = local_2a4._2_1_ ^ 0xff;
        bVar69 = local_2a0._2_1_ ^ 0xff;
        bVar70 = local_29a ^ 0xff;
        bVar71 = local_296 ^ 0xff;
        bVar72 = local_292 ^ 0xff;
        bVar73 = local_28e ^ 0xff;
        bVar74 = local_28a ^ 0xff;
        auVar93[0] = (bVar41 < bVar60) * bVar41 | (bVar41 >= bVar60) * bVar60;
        auVar93[1] = 0;
        auVar93[2] = (bVar61 < bVar62) * bVar61 | (bVar61 >= bVar62) * bVar62;
        auVar93[3] = 0;
        auVar93[4] = (bVar63 < bVar64) * bVar63 | (bVar63 >= bVar64) * bVar64;
        auVar93[5] = 0;
        auVar93[6] = (bVar65 < bVar66) * bVar65 | (bVar65 >= bVar66) * bVar66;
        auVar93[7] = 0;
        auVar93[8] = (bVar67 < bVar68) * bVar67 | (bVar67 >= bVar68) * bVar68;
        auVar93[9] = 0;
        auVar93[10] = (bVar69 < bVar70) * bVar69 | (bVar69 >= bVar70) * bVar70;
        auVar93[0xb] = 0;
        auVar93[0xc] = (bVar71 < bVar72) * bVar71 | (bVar71 >= bVar72) * bVar72;
        auVar93[0xd] = 0;
        auVar93[0xe] = (bVar73 < bVar74) * bVar73 | (bVar73 >= bVar74) * bVar74;
        auVar93[0xf] = 0;
        auVar96 = phminposuw(auVar93);
        bVar41 = local_2c8.field_0.a ^ 0xff;
        bVar60 = uStack_2c4._3_1_ ^ 0xff;
        bVar61 = uStack_2c0._3_1_ ^ 0xff;
        bVar62 = bStack_2b9 ^ 0xff;
        bVar63 = uStack_2b8._3_1_ ^ 0xff;
        bVar64 = local_2b4._3_1_ ^ 0xff;
        bVar65 = local_2b0._3_1_ ^ 0xff;
        bVar66 = local_2a9 ^ 0xff;
        bVar67 = local_2a8._3_1_ ^ 0xff;
        bVar68 = local_2a4._3_1_ ^ 0xff;
        bVar69 = local_2a0._3_1_ ^ 0xff;
        bVar70 = local_299 ^ 0xff;
        bVar71 = local_295 ^ 0xff;
        bVar72 = local_291 ^ 0xff;
        bVar73 = local_28d ^ 0xff;
        bVar74 = local_289 ^ 0xff;
        auVar76[0] = (bVar41 < bVar60) * bVar41 | (bVar41 >= bVar60) * bVar60;
        auVar76[1] = 0;
        auVar76[2] = (bVar61 < bVar62) * bVar61 | (bVar61 >= bVar62) * bVar62;
        auVar76[3] = 0;
        auVar76[4] = (bVar63 < bVar64) * bVar63 | (bVar63 >= bVar64) * bVar64;
        auVar76[5] = 0;
        auVar76[6] = (bVar65 < bVar66) * bVar65 | (bVar65 >= bVar66) * bVar66;
        auVar76[7] = 0;
        auVar76[8] = (bVar67 < bVar68) * bVar67 | (bVar67 >= bVar68) * bVar68;
        auVar76[9] = 0;
        auVar76[10] = (bVar69 < bVar70) * bVar69 | (bVar69 >= bVar70) * bVar70;
        auVar76[0xb] = 0;
        auVar76[0xc] = (bVar71 < bVar72) * bVar71 | (bVar71 >= bVar72) * bVar72;
        auVar76[0xd] = 0;
        auVar76[0xe] = (bVar73 < bVar74) * bVar73 | (bVar73 >= bVar74) * bVar74;
        auVar76[0xf] = 0;
        auVar95 = phminposuw(auVar76);
        bVar41 = ~auVar95[0];
        if ((ulong)bVar41 - 0xef < 0x11) {
          if (0x1f < (byte)(g_pvrtc_5_ceil[(byte)~auVar97[0]] | g_pvrtc_5_ceil[(byte)~auVar98[0]] |
                           g_pvrtc_5_ceil[(byte)~auVar96[0]])) {
            __assert_fail("(r < 32) && (g < 32) && (b < 32)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xc55,
                          "void basist::pvrtc4_block::set_endpoint_raw(uint32_t, const color32 &, bool)"
                         );
          }
          uVar19 = ((uint)(byte)g_pvrtc_5_ceil[(byte)~auVar97[0]] << 5 |
                    (uint)(byte)g_pvrtc_5_ceil[(byte)~auVar98[0]] << 10 |
                   (uint)(byte)g_pvrtc_5_ceil[(byte)~auVar96[0]]) << 0x10 | uVar19 & 0xffff |
                   0x80000000;
        }
        else {
          if (0xee < bVar41) {
LAB_00143ffe:
            __assert_fail("(r < 16) && (g < 16) && (b < 16) && (a < 8)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xc66,
                          "void basist::pvrtc4_block::set_endpoint_raw(uint32_t, const color32 &, bool)"
                         );
          }
          if (0xf < (byte)(g_pvrtc_4_ceil[(byte)~auVar97[0]] | g_pvrtc_4_ceil[(byte)~auVar98[0]] |
                          g_pvrtc_4_ceil[(byte)~auVar96[0]])) goto LAB_00143ffe;
          uVar19 = ((uint)(byte)g_pvrtc_4_ceil[(byte)~auVar97[0]] << 4 |
                    (uint)(byte)g_pvrtc_4_ceil[(byte)~auVar98[0]] << 8 |
                   (uint)(byte)g_pvrtc_4_ceil[(byte)~auVar96[0]]) << 0x10 |
                   (uint)(byte)g_pvrtc_alpha_ceil[bVar41] << 0x1c | uVar19 & 0xffff;
        }
        if (uVar29 <= uVar32) goto LAB_00143fc0;
        *(uint *)((long)pvVar1 + uVar32 * 4) = uVar19;
        if (!bVar9) goto LAB_00142e65;
        uVar32 = uVar32 + 1;
        blk = blk + 1;
        uVar52 = uVar52 - 1;
      } while (uVar52 != 0);
      uVar18 = uVar18 + 1;
      local_208 = CONCAT71((int7)((ulong)blk >> 8),local_188 <= uVar18);
      uVar31 = (ulong)(uint)((int)uVar31 + (int)local_238);
    } while (uVar18 != local_278);
LAB_00142e76:
    if (local_198.m_size == 0) {
LAB_00143fc0:
      __assert_fail("i < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                    ,0x178,"T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]")
      ;
    }
    local_284 = (int)local_238 - 1;
    local_1a4 = (int)local_1f8 - 1;
    uVar19 = 0x1f;
    if (local_284 != 0) {
      for (; local_284 >> uVar19 == 0; uVar19 = uVar19 - 1) {
      }
    }
    uVar19 = (uVar19 ^ 0xffffffe0) + 0x21;
    if (local_284 == 0) {
      uVar19 = 0;
    }
    uVar38 = 0x1f;
    if (local_1a4 != 0) {
      for (; local_1a4 >> uVar38 == 0; uVar38 = uVar38 - 1) {
      }
    }
    uVar38 = (uVar38 ^ 0xffffffe0) + 0x21;
    if (local_1a4 == 0) {
      uVar38 = 0;
    }
    if (uVar19 < uVar38) {
      uVar38 = uVar19;
    }
    local_180 = (ulong)uVar38;
    local_260 = uVar38 * 2;
    local_25c = -1 << ((byte)local_260 & 0x1f);
    if (0 < (int)local_1f8) {
      local_158 = local_198.m_p;
      local_25c = ~local_25c;
      uVar18 = 0;
      local_1f0 = 0;
      do {
        paVar51 = &local_2c8;
        puVar53 = &local_d8;
        lVar37 = 0;
        local_200 = uVar18;
        do {
          uVar19 = local_284;
          pvVar1 = (void *)((long)local_158 +
                           (ulong)(((int)uVar18 + -1 + (int)lVar37 & local_1a4) * (int)local_238) *
                           4);
          local_48[lVar37] = (long)pvVar1;
          uVar38 = 0xffffffff;
          lVar33 = 0;
          do {
            uVar25 = *(uint32_t *)((long)pvVar1 + (ulong)(uVar38 & uVar19) * 4);
            uVar10 = get_endpoint_l8(uVar25,0);
            *(uint32_t *)((long)paVar51 + lVar33) = uVar10;
            uVar25 = get_endpoint_l8(uVar25,1);
            *(uint32_t *)((long)puVar53 + lVar33) = uVar25;
            lVar33 = lVar33 + 0x10;
            uVar38 = uVar38 + 1;
          } while (lVar33 != 0x30);
          lVar37 = lVar37 + 1;
          puVar53 = puVar53 + 1;
          paVar51 = paVar51 + 1;
        } while (lVar37 != 3);
        uVar18 = (ulong)local_d8;
        if (0 < (int)local_238) {
          local_1ac = ((uint)local_200 >> ((byte)local_180 & 0x1f)) << ((byte)local_260 & 0x1f);
          local_1a8 = CONCAT22((&g_pvrtc_swizzle_table)[local_200 >> 8 & 0xffffff],
                               (&g_pvrtc_swizzle_table)[local_200 & 0xff]);
          local_80 = local_48[0];
          local_88 = local_48[1];
          local_90 = local_48[2];
          local_2e8 = (ulong)uStack_2c4;
          local_2e0 = (ulong)local_d4;
          local_220 = (ulong)local_d0;
          local_1e0 = (ulong)local_c0;
          uVar31 = 0;
          uVar29 = (ulong)uStack_2b8;
          uVar32 = (ulong)local_c8;
          iVar35 = uStack_2c0;
          local_270 = (ulong)local_c4;
          local_268 = (ulong)local_2b4;
          local_1e8 = (ulong)local_2c8.m;
          local_1d8 = (ulong)local_2b0;
          do {
            uVar8 = local_238;
            uVar52 = local_270;
            local_1c0 = uVar29 & 0xffffffff;
            local_210 = local_268;
            local_1c8 = uVar32 & 0xffffffff;
            local_278 = local_1d8;
            local_218 = local_1e0;
            uVar19 = (uint)uVar31;
            uVar29 = (ulong)((int)local_1f0 + uVar19);
            unpack_uastc(local_178 + uVar29,(color32 *)&local_118.field_0,false);
            uVar38 = (uint)(ushort)(&g_pvrtc_swizzle_table)[uVar31 & 0xff] * 2 |
                     (uint)(ushort)(&g_pvrtc_swizzle_table)[uVar31 >> 8 & 0xffffff] << 0x11 |
                     local_1a8;
            if ((uint)uVar8 != (uint)local_1f8) {
              if ((uint)local_1f8 < (uint)uVar8) {
                uVar38 = uVar38 & local_25c |
                         (uVar19 >> ((byte)local_180 & 0x1f)) << ((byte)local_260 & 0x1f);
              }
              else {
                uVar38 = uVar38 & local_25c | local_1ac;
              }
            }
            local_58 = (ulong)uVar38;
            *(undefined4 *)((long)local_160 + local_58 * 8 + 4) =
                 *(undefined4 *)((long)local_158 + uVar29 * 4);
            local_50 = (ulong)(uVar19 + 1);
            uVar31 = (ulong)(uVar19 + 1 & local_284);
            uVar25 = *(uint32_t *)(local_80 + uVar31 * 4);
            local_168 = uVar18;
            uVar10 = get_endpoint_l8(uVar25,0);
            local_1b8 = CONCAT44(extraout_var,uVar10);
            uVar25 = get_endpoint_l8(uVar25,1);
            local_1d0 = CONCAT44(extraout_var_00,uVar25);
            uVar25 = *(uint32_t *)(local_88 + uVar31 * 4);
            uVar10 = get_endpoint_l8(uVar25,0);
            uVar11 = get_endpoint_l8(uVar25,1);
            uVar25 = *(uint32_t *)(local_90 + uVar31 * 4);
            uVar12 = get_endpoint_l8(uVar25,0);
            uVar25 = get_endpoint_l8(uVar25,1);
            local_1e0 = CONCAT44(extraout_var_01,uVar25);
            uVar19 = (uint)local_210;
            uVar38 = (uint)uVar52;
            iVar20 = uVar10 * 3 + uVar19 * 9;
            iVar39 = uVar11 * 3 + uVar38 * 9;
            iVar2 = (int)local_278;
            uVar3 = (uint)local_218;
            iVar30 = iVar2 * 3 + uVar12 + iVar20;
            iVar13 = uVar25 + uVar3 * 3 + iVar39;
            auVar95 = pmovzxbw(ZEXT416(uStack_dc),ZEXT416(uStack_dc));
            sVar75 = auVar95._4_2_;
            auVar77._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar77._2_2_ = sVar92 + auVar95._2_2_;
            auVar77._4_2_ = sVar75 * 2;
            auVar77._6_2_ = sVar92 * 2;
            auVar77._8_2_ = sVar75 + auVar95._8_2_;
            auVar77._10_2_ = sVar92 + auVar95._10_2_;
            auVar77._12_2_ = sVar75 + auVar95._12_2_;
            auVar77._14_2_ = sVar92 + auVar95._14_2_;
            auVar96 = phaddw(auVar77,auVar77);
            local_23c = (uint)auVar96._0_2_ * 0x100 + iVar30 * -0x10;
            if (iVar13 < iVar30) {
              local_23c = -local_23c;
            }
            uVar4 = iVar13 - iVar30;
            if (iVar13 < iVar30) {
              uVar4 = -(iVar13 - iVar30);
            }
            local_120 = (ulong)uVar4;
            iVar13 = uVar19 * 0xc;
            iVar30 = uVar38 * 0xc;
            iVar14 = iVar13 + iVar2 * 4;
            iVar54 = iVar30 + uVar3 * 4;
            auVar95 = pmovzxbw(auVar95,CONCAT44(uStack_dc,local_e0));
            sVar75 = auVar95._4_2_;
            auVar78._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar78._2_2_ = sVar92 + auVar95._2_2_;
            auVar78._4_2_ = sVar75 * 2;
            auVar78._6_2_ = sVar92 * 2;
            auVar78._8_2_ = sVar75 + auVar95._8_2_;
            auVar78._10_2_ = sVar92 + auVar95._10_2_;
            auVar78._12_2_ = sVar75 + auVar95._12_2_;
            auVar78._14_2_ = sVar92 + auVar95._14_2_;
            auVar95 = phaddw(auVar78,auVar78);
            local_240 = (uint)auVar95._0_2_ * 0x100 + iVar14 * -0x10;
            if (iVar54 < iVar14) {
              local_240 = -local_240;
            }
            auVar95 = pmovzxbw(ZEXT416(local_ec),ZEXT416(local_ec));
            sVar75 = auVar95._4_2_;
            auVar79._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar79._2_2_ = sVar92 + auVar95._2_2_;
            auVar79._4_2_ = sVar75 * 2;
            auVar79._6_2_ = sVar92 * 2;
            auVar79._8_2_ = sVar75 + auVar95._8_2_;
            auVar79._10_2_ = sVar92 + auVar95._10_2_;
            auVar79._12_2_ = sVar75 + auVar95._12_2_;
            auVar79._14_2_ = sVar92 + auVar95._14_2_;
            auVar95 = phaddw(auVar79,auVar79);
            iVar15 = iVar13 + uVar10 * 4;
            iVar57 = iVar30 + uVar11 * 4;
            uVar50 = iVar54 - iVar14;
            if (iVar54 < iVar14) {
              uVar50 = -(iVar54 - iVar14);
            }
            local_60 = (ulong)uVar50;
            local_244 = (uint)auVar95._0_2_ * 0x100 + iVar15 * -0x10;
            if (iVar57 < iVar15) {
              local_244 = -local_244;
            }
            uVar59 = iVar57 - iVar15;
            if (iVar57 < iVar15) {
              uVar59 = -(iVar57 - iVar15);
            }
            local_128 = (ulong)uVar59;
            iVar15 = uVar38 * 0x10;
            iVar54 = (uint)local_ee + (uint)local_ef + (local_f0 - uVar19) + (uint)local_ed;
            local_19c = iVar54 * 0x100;
            iVar14 = iVar15 + uVar19 * -0x10;
            if (SBORROW4(iVar15,uVar19 * 0x10) != iVar14 < 0) {
              local_19c = iVar54 * -0x100;
            }
            uVar26 = iVar15 + uVar19 * -0x10;
            iVar54 = (int)local_2e8;
            if (SBORROW4(iVar15,uVar19 * 0x10) != (int)uVar26 < 0) {
              uVar26 = -iVar14;
            }
            local_130 = (ulong)uVar26;
            iVar14 = (int)local_2e0;
            iVar15 = iVar54 * 3 + uVar19 * 9;
            iVar57 = iVar14 * 3 + uVar38 * 9;
            iVar34 = iVar2 * 3 + iVar35 + iVar15;
            iVar42 = uVar3 * 3 + (int)local_220 + iVar57;
            auVar95 = pmovzxbw(ZEXT416(uStack_e4),ZEXT416(uStack_e4));
            sVar75 = auVar95._4_2_;
            auVar80._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar80._2_2_ = sVar92 + auVar95._2_2_;
            auVar80._4_2_ = sVar75 * 2;
            auVar80._6_2_ = sVar92 * 2;
            auVar80._8_2_ = sVar75 + auVar95._8_2_;
            auVar80._10_2_ = sVar92 + auVar95._10_2_;
            auVar80._12_2_ = sVar75 + auVar95._12_2_;
            auVar80._14_2_ = sVar92 + auVar95._14_2_;
            auVar96 = phaddw(auVar80,auVar80);
            uVar28 = iVar42 - iVar34;
            if (iVar42 < iVar34) {
              uVar28 = -(iVar42 - iVar34);
            }
            local_138 = (ulong)uVar28;
            local_248 = (uint)auVar96._0_2_ * 0x100 + iVar34 * -0x10;
            if (iVar42 < iVar34) {
              local_248 = -local_248;
            }
            iVar34 = iVar54 + uVar19;
            uVar55 = uVar38 + iVar14;
            local_170 = (ulong)uVar55;
            uVar21 = iVar34 * 6;
            local_68 = (ulong)uVar21;
            uVar27 = uVar55 * 6;
            local_70 = (ulong)uVar27;
            iVar35 = uVar21 + (iVar35 + iVar2) * 2;
            iVar42 = uVar27 + ((int)local_220 + uVar3) * 2;
            auVar95 = pmovzxbw(auVar95,CONCAT44(uStack_e4,local_e8));
            sVar75 = auVar95._4_2_;
            auVar81._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar81._2_2_ = sVar92 + auVar95._2_2_;
            auVar81._4_2_ = sVar75 * 2;
            auVar81._6_2_ = sVar92 * 2;
            auVar81._8_2_ = sVar75 + auVar95._8_2_;
            auVar81._10_2_ = sVar92 + auVar95._10_2_;
            auVar81._12_2_ = sVar75 + auVar95._12_2_;
            auVar81._14_2_ = sVar92 + auVar95._14_2_;
            auVar95 = phaddw(auVar81,auVar81);
            uVar5 = iVar42 - iVar35;
            if (iVar42 < iVar35) {
              uVar5 = -(iVar42 - iVar35);
            }
            local_24c = (uint)auVar95._0_2_ * 0x100 + iVar35 * -0x10;
            if (iVar42 < iVar35) {
              local_24c = -local_24c;
            }
            iVar35 = iVar13 + iVar54 * 4;
            iVar42 = iVar30 + iVar14 * 4;
            auVar95 = pmovzxbw(ZEXT416(uStack_f4),ZEXT416(uStack_f4));
            sVar75 = auVar95._4_2_;
            auVar82._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar82._2_2_ = sVar92 + auVar95._2_2_;
            auVar82._4_2_ = sVar75 * 2;
            auVar82._6_2_ = sVar92 * 2;
            auVar82._8_2_ = sVar75 + auVar95._8_2_;
            auVar82._10_2_ = sVar92 + auVar95._10_2_;
            auVar82._12_2_ = sVar75 + auVar95._12_2_;
            auVar82._14_2_ = sVar92 + auVar95._14_2_;
            auVar96 = phaddw(auVar82,auVar82);
            uVar45 = iVar42 - iVar35;
            if (iVar42 < iVar35) {
              uVar45 = -(iVar42 - iVar35);
            }
            local_140 = (ulong)uVar45;
            local_1a0 = (uint)auVar96._0_2_ * 0x100 + iVar35 * -0x10;
            if (iVar42 < iVar35) {
              local_1a0 = -local_1a0;
            }
            iVar35 = uVar55 * 8;
            auVar95 = pmovzxbw(auVar95,CONCAT44(uStack_f4,local_f8));
            sVar75 = auVar95._4_2_;
            auVar83._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar83._2_2_ = sVar92 + auVar95._2_2_;
            auVar83._4_2_ = sVar75 * 2;
            auVar83._6_2_ = sVar92 * 2;
            auVar83._8_2_ = sVar75 + auVar95._8_2_;
            auVar83._10_2_ = sVar92 + auVar95._10_2_;
            auVar83._12_2_ = sVar75 + auVar95._12_2_;
            auVar83._14_2_ = sVar92 + auVar95._14_2_;
            auVar95 = phaddw(auVar83,auVar83);
            uVar56 = iVar35 + iVar34 * -8;
            if (SBORROW4(iVar35,iVar34 * 8) != (int)uVar56 < 0) {
              uVar56 = -(iVar35 + iVar34 * -8);
            }
            local_148 = (ulong)uVar56;
            local_250 = (uint)auVar95._0_2_ * 0x100 + iVar34 * -0x80;
            if (SBORROW4(iVar35,iVar34 * 8) != iVar35 + iVar34 * -8 < 0) {
              local_250 = -local_250;
            }
            aVar6.m = (uint32_t)local_1c0;
            uVar7 = (uint)local_1c8;
            uVar43 = (uint)local_1b8;
            iVar20 = iVar20 + uVar43 + aVar6.m * 3;
            uVar47 = (uint)local_1d0;
            iVar39 = iVar39 + uVar47 + uVar7 * 3;
            auVar95 = pmovzxbw(ZEXT416(uStack_fc),ZEXT416(uStack_fc));
            sVar75 = auVar95._4_2_;
            auVar84._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar84._2_2_ = sVar92 + auVar95._2_2_;
            auVar84._4_2_ = sVar75 * 2;
            auVar84._6_2_ = sVar92 * 2;
            auVar84._8_2_ = sVar75 + auVar95._8_2_;
            auVar84._10_2_ = sVar92 + auVar95._10_2_;
            auVar84._12_2_ = sVar75 + auVar95._12_2_;
            auVar84._14_2_ = sVar92 + auVar95._14_2_;
            auVar96 = phaddw(auVar84,auVar84);
            iVar35 = iVar39 - iVar20;
            if (iVar39 < iVar20) {
              iVar35 = -(iVar39 - iVar20);
            }
            local_254 = (uint)auVar96._0_2_ * 0x100 + iVar20 * -0x10;
            if (iVar39 < iVar20) {
              local_254 = -local_254;
            }
            iVar13 = iVar13 + aVar6.m * 4;
            iVar30 = iVar30 + uVar7 * 4;
            auVar95 = pmovzxbw(auVar95,CONCAT44(uStack_fc,local_100));
            sVar75 = auVar95._4_2_;
            auVar85._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar85._2_2_ = sVar92 + auVar95._2_2_;
            auVar85._4_2_ = sVar75 * 2;
            auVar85._6_2_ = sVar92 * 2;
            auVar85._8_2_ = sVar75 + auVar95._8_2_;
            auVar85._10_2_ = sVar92 + auVar95._10_2_;
            auVar85._12_2_ = sVar75 + auVar95._12_2_;
            auVar85._14_2_ = sVar92 + auVar95._14_2_;
            auVar95 = phaddw(auVar85,auVar85);
            iVar20 = iVar30 - iVar13;
            if (iVar30 < iVar13) {
              iVar20 = -(iVar30 - iVar13);
            }
            local_258 = (uint)auVar95._0_2_ * 0x100 + iVar13 * -0x10;
            if (iVar30 < iVar13) {
              local_258 = -local_258;
            }
            iVar42 = uVar19 + aVar6.m;
            uVar17 = iVar42 * 6;
            local_78 = (ulong)uVar17;
            iVar30 = (uVar7 + uVar38) * 6;
            iVar39 = uVar17 + (uVar10 + uVar43) * 2;
            iVar13 = iVar30 + (uVar11 + uVar47) * 2;
            auVar95 = pmovzxbw(ZEXT416(uStack_10c),ZEXT416(uStack_10c));
            sVar75 = auVar95._4_2_;
            auVar86._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar86._2_2_ = sVar92 + auVar95._2_2_;
            auVar86._4_2_ = sVar75 * 2;
            auVar86._6_2_ = sVar92 * 2;
            auVar86._8_2_ = sVar75 + auVar95._8_2_;
            auVar86._10_2_ = sVar92 + auVar95._10_2_;
            auVar86._12_2_ = sVar75 + auVar95._12_2_;
            auVar86._14_2_ = sVar92 + auVar95._14_2_;
            auVar96 = phaddw(auVar86,auVar86);
            uVar24 = iVar13 - iVar39;
            if (iVar13 < iVar39) {
              uVar24 = -(iVar13 - iVar39);
            }
            local_150 = (ulong)uVar24;
            iVar48 = (uint)auVar96._0_2_ * 0x100 + iVar39 * -0x10;
            if (iVar13 < iVar39) {
              iVar48 = -iVar48;
            }
            iVar39 = (uVar7 + uVar38) * 8;
            iVar13 = iVar39 + iVar42 * -8;
            auVar95 = pmovzxbw(auVar95,CONCAT44(uStack_10c,local_110));
            sVar75 = auVar95._4_2_;
            auVar87._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar87._2_2_ = sVar92 + auVar95._2_2_;
            auVar87._4_2_ = sVar75 * 2;
            auVar87._6_2_ = sVar92 * 2;
            auVar87._8_2_ = sVar75 + auVar95._8_2_;
            auVar87._10_2_ = sVar92 + auVar95._10_2_;
            auVar87._12_2_ = sVar75 + auVar95._12_2_;
            auVar87._14_2_ = sVar92 + auVar95._14_2_;
            auVar95 = phaddw(auVar87,auVar87);
            if (SBORROW4(iVar39,iVar42 * 8) != iVar13 < 0) {
              iVar13 = -(iVar39 + iVar42 * -8);
            }
            iVar49 = (uint)auVar95._0_2_ * 0x100 + iVar42 * -0x80;
            if (SBORROW4(iVar39,iVar42 * 8) != iVar39 + iVar42 * -8 < 0) {
              iVar49 = -iVar49;
            }
            iVar58 = (int)local_1e8;
            iVar15 = iVar15 + aVar6.m * 3 + iVar58;
            iVar42 = (int)local_168;
            iVar57 = iVar57 + uVar7 * 3 + iVar42;
            auVar95 = pmovzxbw(ZEXT416(uStack_104),ZEXT416(uStack_104));
            sVar75 = auVar95._4_2_;
            auVar88._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar88._2_2_ = sVar92 + auVar95._2_2_;
            auVar88._4_2_ = sVar75 * 2;
            auVar88._6_2_ = sVar92 * 2;
            auVar88._8_2_ = sVar75 + auVar95._8_2_;
            auVar88._10_2_ = sVar92 + auVar95._10_2_;
            auVar88._12_2_ = sVar75 + auVar95._12_2_;
            auVar88._14_2_ = sVar92 + auVar95._14_2_;
            auVar96 = phaddw(auVar88,auVar88);
            iVar39 = iVar57 - iVar15;
            if (iVar57 < iVar15) {
              iVar39 = -(iVar57 - iVar15);
            }
            iVar44 = (uint)auVar96._0_2_ * 0x100 + iVar15 * -0x10;
            if (iVar57 < iVar15) {
              iVar44 = -iVar44;
            }
            iVar57 = uVar21 + (iVar58 + aVar6.m) * 2;
            iVar40 = uVar27 + (iVar42 + uVar7) * 2;
            auVar95 = pmovzxbw(auVar95,CONCAT44(uStack_104,local_108));
            sVar75 = auVar95._4_2_;
            auVar89._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar89._2_2_ = sVar92 + auVar95._2_2_;
            auVar89._4_2_ = sVar75 * 2;
            auVar89._6_2_ = sVar92 * 2;
            auVar89._8_2_ = sVar75 + auVar95._8_2_;
            auVar89._10_2_ = sVar92 + auVar95._10_2_;
            auVar89._12_2_ = sVar75 + auVar95._12_2_;
            auVar89._14_2_ = sVar92 + auVar95._14_2_;
            auVar95 = phaddw(auVar89,auVar89);
            iVar15 = iVar40 - iVar57;
            if (iVar40 < iVar57) {
              iVar15 = -(iVar40 - iVar57);
            }
            iVar16 = (uint)auVar95._0_2_ * 0x100 + iVar57 * -0x10;
            if (iVar40 < iVar57) {
              iVar16 = -iVar16;
            }
            iVar54 = uVar17 + (iVar58 + iVar54) * 2;
            iVar30 = iVar30 + (iVar42 + iVar14) * 2;
            auVar95 = pmovzxbw(ZEXT416(uStack_114),ZEXT416(uStack_114));
            sVar75 = auVar95._4_2_;
            auVar90._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar90._2_2_ = sVar92 + auVar95._2_2_;
            auVar90._4_2_ = sVar75 * 2;
            auVar90._6_2_ = sVar92 * 2;
            auVar90._8_2_ = sVar75 + auVar95._8_2_;
            auVar90._10_2_ = sVar92 + auVar95._10_2_;
            auVar90._12_2_ = sVar75 + auVar95._12_2_;
            auVar90._14_2_ = sVar92 + auVar95._14_2_;
            auVar96 = phaddw(auVar90,auVar90);
            iVar14 = iVar30 - iVar54;
            if (iVar30 < iVar54) {
              iVar14 = -(iVar30 - iVar54);
            }
            iVar57 = (uint)auVar96._0_2_ * 0x100 + iVar54 * -0x10;
            if (iVar30 < iVar54) {
              iVar57 = -iVar57;
            }
            iVar34 = iVar58 + aVar6.m + iVar34;
            iVar54 = (iVar42 + uVar7 + uVar55) * 4;
            iVar30 = iVar54 + iVar34 * -4;
            auVar95 = pmovzxbw(auVar95,CONCAT44(uStack_114,local_118.m));
            sVar75 = auVar95._4_2_;
            auVar91._0_2_ = sVar75 + auVar95._0_2_;
            sVar92 = auVar95._6_2_;
            auVar91._2_2_ = sVar92 + auVar95._2_2_;
            auVar91._4_2_ = sVar75 * 2;
            auVar91._6_2_ = sVar92 * 2;
            auVar91._8_2_ = sVar75 + auVar95._8_2_;
            auVar91._10_2_ = sVar92 + auVar95._10_2_;
            auVar91._12_2_ = sVar75 + auVar95._12_2_;
            auVar91._14_2_ = sVar92 + auVar95._14_2_;
            auVar95 = phaddw(auVar91,auVar91);
            if (SBORROW4(iVar54,iVar34 * 4) != iVar30 < 0) {
              iVar30 = -(iVar54 + iVar34 * -4);
            }
            iVar42 = (uint)auVar95._0_2_ * 0x100 + iVar34 * -0x40;
            if (SBORROW4(iVar54,iVar34 * 4) != iVar54 + iVar34 * -4 < 0) {
              iVar42 = -iVar42;
            }
            uVar21 = 2;
            if (iVar42 == iVar30 * 8 || SBORROW4(iVar42,iVar30 * 8) != iVar42 + iVar30 * -8 < 0) {
              uVar21 = (uint)(iVar42 != iVar30 * 3 &&
                             SBORROW4(iVar42,iVar30 * 3) == iVar42 + iVar30 * -3 < 0);
            }
            uVar27 = 3;
            if (iVar42 <= iVar30 * 0xd) {
              uVar27 = uVar21;
            }
            iVar30 = 8;
            if (iVar57 == iVar14 * 8 || SBORROW4(iVar57,iVar14 * 8) != iVar57 + iVar14 * -8 < 0) {
              iVar30 = (uint)(iVar57 != iVar14 * 3 &&
                             SBORROW4(iVar57,iVar14 * 3) == iVar57 + iVar14 * -3 < 0) << 2;
            }
            iVar54 = 0xc;
            if (iVar57 <= iVar14 * 0xd) {
              iVar54 = iVar30;
            }
            iVar30 = 0x200;
            if (iVar16 == iVar15 * 8 || SBORROW4(iVar16,iVar15 * 8) != iVar16 + iVar15 * -8 < 0) {
              iVar30 = (uint)(iVar16 != iVar15 * 3 &&
                             SBORROW4(iVar16,iVar15 * 3) == iVar16 + iVar15 * -3 < 0) << 8;
            }
            iVar14 = 0x300;
            if (iVar16 <= iVar15 * 0xd) {
              iVar14 = iVar30;
            }
            uVar21 = 0x800;
            if (iVar44 == iVar39 * 8 || SBORROW4(iVar44,iVar39 * 8) != iVar44 + iVar39 * -8 < 0) {
              uVar21 = (uint)(iVar44 != iVar39 * 3 &&
                             SBORROW4(iVar44,iVar39 * 3) == iVar44 + iVar39 * -3 < 0) << 10;
            }
            uVar55 = 0xc00;
            if (iVar44 <= iVar39 * 0xd) {
              uVar55 = uVar21;
            }
            local_230 = (ulong)uVar55;
            uVar21 = 0x20;
            if (iVar49 == iVar13 * 8 || SBORROW4(iVar49,iVar13 * 8) != iVar49 + iVar13 * -8 < 0) {
              uVar21 = (uint)(iVar49 != iVar13 * 3 &&
                             SBORROW4(iVar49,iVar13 * 3) == iVar49 + iVar13 * -3 < 0) << 4;
            }
            uVar17 = 0x30;
            if (iVar49 <= iVar13 * 0xd) {
              uVar17 = uVar21;
            }
            uVar21 = 0x80;
            if (iVar48 == uVar24 * 8 ||
                SBORROW4(iVar48,uVar24 * 8) != (int)(iVar48 + uVar24 * -8) < 0) {
              uVar21 = (uint)((int)(uVar24 * 3) < iVar48) << 6;
            }
            uVar23 = 0xc0;
            if (iVar48 <= (int)(uVar24 * 0xd)) {
              uVar23 = uVar21;
            }
            uVar21 = 0x2000;
            if (local_258 == iVar20 * 8 ||
                SBORROW4(local_258,iVar20 * 8) != local_258 + iVar20 * -8 < 0) {
              uVar21 = (uint)(iVar20 * 3 < local_258) << 0xc;
            }
            uVar24 = 0x3000;
            if (local_258 <= iVar20 * 0xd) {
              uVar24 = uVar21;
            }
            local_280 = (ulong)uVar24;
            uVar21 = 0x8000;
            if (local_254 == iVar35 * 8 ||
                SBORROW4(local_254,iVar35 * 8) != local_254 + iVar35 * -8 < 0) {
              uVar21 = (uint)(iVar35 * 3 < local_254) << 0xe;
            }
            uVar22 = 0xc000;
            if (local_254 <= iVar35 * 0xd) {
              uVar22 = uVar21;
            }
            local_228 = (ulong)uVar22;
            uVar21 = 0x20000;
            if (local_250 == uVar56 * 8 ||
                SBORROW4(local_250,uVar56 * 8) != (int)(local_250 + uVar56 * -8) < 0) {
              uVar21 = (uint)((int)(uVar56 * 3) < local_250) << 0x10;
            }
            uVar36 = 0x30000;
            if (local_250 <= (int)(uVar56 * 0xd)) {
              uVar36 = uVar21;
            }
            uVar21 = 0x80000;
            if (local_1a0 == uVar45 * 8 ||
                SBORROW4(local_1a0,uVar45 * 8) != (int)(local_1a0 + uVar45 * -8) < 0) {
              uVar21 = (uint)((int)(uVar45 * 3) < local_1a0) << 0x12;
            }
            uVar56 = 0xc0000;
            if (local_1a0 <= (int)(uVar45 * 0xd)) {
              uVar56 = uVar21;
            }
            uVar21 = 0x2000000;
            if (local_24c == uVar5 * 8 ||
                SBORROW4(local_24c,uVar5 * 8) != (int)(local_24c + uVar5 * -8) < 0) {
              uVar21 = (uint)((int)(uVar5 * 3) < local_24c) << 0x18;
            }
            uVar45 = 0x3000000;
            if (local_24c <= (int)(uVar5 * 0xd)) {
              uVar45 = uVar21;
            }
            uVar21 = 0x8000000;
            if (local_248 == uVar28 * 8 ||
                SBORROW4(local_248,uVar28 * 8) != (int)(local_248 + uVar28 * -8) < 0) {
              uVar21 = (uint)((int)(uVar28 * 3) < local_248) << 0x1a;
            }
            uVar46 = 0xc000000;
            if (local_248 <= (int)(uVar28 * 0xd)) {
              uVar46 = uVar21;
            }
            uVar28 = 0x200000;
            if (local_19c == uVar26 * 8 ||
                SBORROW4(local_19c,uVar26 * 8) != (int)(local_19c + uVar26 * -8) < 0) {
              uVar28 = (uint)((int)(uVar26 * 3) < local_19c) << 0x14;
            }
            uVar21 = 0x300000;
            if (local_19c <= (int)(uVar26 * 0xd)) {
              uVar21 = uVar28;
            }
            uVar26 = 0x800000;
            if (local_244 == uVar59 * 8 ||
                SBORROW4(local_244,uVar59 * 8) != (int)(local_244 + uVar59 * -8) < 0) {
              uVar26 = (uint)((int)(uVar59 * 3) < local_244) << 0x16;
            }
            uVar28 = 0xc00000;
            if (local_244 <= (int)(uVar59 * 0xd)) {
              uVar28 = uVar26;
            }
            uVar59 = 0x20000000;
            if (local_240 == uVar50 * 8 ||
                SBORROW4(local_240,uVar50 * 8) != (int)(local_240 + uVar50 * -8) < 0) {
              uVar59 = (uint)((int)(uVar50 * 3) < local_240) << 0x1c;
            }
            uVar26 = 0x30000000;
            if (local_240 <= (int)(uVar50 * 0xd)) {
              uVar26 = uVar59;
            }
            uVar50 = 0x80000000;
            if (local_23c == uVar4 * 8 ||
                SBORROW4(local_23c,uVar4 * 8) != (int)(local_23c + uVar4 * -8) < 0) {
              uVar50 = (uint)((int)(uVar4 * 3) < local_23c) << 0x1e;
            }
            uVar59 = 0xc0000000;
            if (local_23c <= (int)(uVar4 * 0xd)) {
              uVar59 = uVar50;
            }
            *(uint *)((long)local_160 + local_58 * 8) =
                 uVar28 | uVar26 | uVar59 |
                 uVar36 | uVar56 | uVar45 | uVar46 | uVar21 |
                 uVar17 | uVar23 | uVar24 | uVar22 | iVar54 + uVar27 + iVar14 | uVar55;
            local_220 = local_218 & 0xffffffff;
            local_2e0 = uVar52;
            local_2e8 = local_210 & 0xffffffff;
            local_1e8 = local_1c0 & 0xffffffff;
            uVar18 = local_1c8 & 0xffffffff;
            uVar31 = local_50;
            uVar29 = local_1b8;
            uVar32 = local_1d0;
            iVar35 = iVar2;
            local_270 = (ulong)uVar11;
            local_268 = (ulong)uVar10;
            local_1d8 = (ulong)uVar12;
          } while ((int)local_238 != (int)local_50);
          local_1f0 = (ulong)(uint)((int)local_1f0 + (int)local_50);
          local_d8 = uVar7;
          local_2c8.m = aVar6.m;
          uStack_2c4 = uVar19;
          uStack_2c0 = iVar2;
          uStack_2b8 = uVar43;
          local_2b4 = uVar10;
          local_2b0 = uVar12;
          local_2a8 = uVar43;
          local_2a4 = uVar10;
          local_2a0 = uVar12;
          local_220 = (ulong)uVar5;
          local_d4 = uVar38;
          local_d0 = uVar3;
          local_c8 = uVar47;
          local_c4 = uVar11;
          local_c0 = uVar25;
          local_b8 = uVar47;
          local_b4 = uVar11;
          local_b0 = uVar25;
        }
        uVar18 = local_200 + 1;
      } while (uVar18 != local_188);
    }
LAB_00143fa5:
    bVar41 = (byte)local_208;
    if (local_198.m_p != (void *)0x0) {
      free(local_198.m_p);
    }
  }
  return (bool)(bVar41 & 1);
}

Assistant:

bool transcode_uastc_to_pvrtc1_4_rgba(const uastc_block* pSrc_blocks, void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, bool high_quality)
	{
		BASISU_NOTE_UNUSED(high_quality);

		if ((!num_blocks_x) || (!num_blocks_y))
			return false;

		const uint32_t width = num_blocks_x * 4;
		const uint32_t height = num_blocks_y * 4;
		if (!basisu::is_pow2(width) || !basisu::is_pow2(height))
			return false;

		basisu::vector<uint32_t> temp_endpoints(num_blocks_x * num_blocks_y);

		for (uint32_t y = 0; y < num_blocks_y; y++)
		{
			for (uint32_t x = 0; x < num_blocks_x; x++)
			{
				color32 block_pixels[16];
				if (!unpack_uastc(pSrc_blocks[x + y * num_blocks_x], block_pixels, false))
					return false;

				// Get block's RGBA bounding box 
				color32 low_color(255, 255, 255, 255), high_color(0, 0, 0, 0);

				for (uint32_t i = 0; i < 16; i++)
				{
					low_color = color32::comp_min(low_color, block_pixels[i]);
					high_color = color32::comp_max(high_color, block_pixels[i]);
				}

				// Set PVRTC1 endpoints to floor/ceil of bounding box's coordinates.
				pvrtc4_block temp;
				temp.set_endpoint_floor(0, low_color);
				temp.set_endpoint_ceil(1, high_color);

				temp_endpoints[x + y * num_blocks_x] = temp.m_endpoints;
			}
		}

		fixup_pvrtc1_4_modulation_rgba(pSrc_blocks, &temp_endpoints[0], pDst_blocks, num_blocks_x, num_blocks_y);

		return true;
	}